

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

void middleOut(bool precompression,ifstream *sourceFile,ofstream *compressedFile)

{
  bool bVar1;
  byte bVar2;
  __type _Var3;
  int iVar4;
  ulong uVar5;
  ostream *poVar6;
  reference this;
  size_type sVar7;
  reference pvVar8;
  istream local_350 [8];
  ifstream loadFile;
  string local_148 [8];
  string currentWord_1;
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  Word local_e8;
  string local_c0 [4];
  int i_1;
  undefined1 local_a0 [8];
  Word newWord;
  int local_54;
  int i;
  bool wordMatch;
  string local_40 [8];
  string currentWord;
  ofstream *compressedFile_local;
  ifstream *sourceFile_local;
  bool precompression_local;
  
  uVar5 = std::ios::fail();
  if ((uVar5 & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"File not found... maybe use pipey");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  if (precompression) {
    std::__cxx11::string::string(local_40);
    while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
      bVar1 = false;
      std::operator>>((istream *)sourceFile,local_40);
      poVar6 = std::operator<<((ostream *)&std::cout,local_40);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      for (local_54 = 0; sVar7 = std::vector<Word,_std::allocator<Word>_>::size(&wordList),
          (ulong)(long)local_54 < sVar7; local_54 = local_54 + 1) {
        std::vector<Word,_std::allocator<Word>_>::operator[](&wordList,(long)local_54);
        Word::getWord_abi_cxx11_((Word *)&newWord._frequency);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&newWord._frequency);
        std::__cxx11::string::~string((string *)&newWord._frequency);
        if (_Var3) {
          bVar1 = true;
          pvVar8 = std::vector<Word,_std::allocator<Word>_>::operator[](&wordList,(long)local_54);
          this = std::vector<Word,_std::allocator<Word>_>::operator[](&wordList,(long)local_54);
          iVar4 = Word::getFrequency(this);
          Word::setFrequency(pvVar8,iVar4 + 1);
        }
      }
      if (!bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Adding word");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::string(local_c0,local_40);
        Word::Word((Word *)local_a0,(string *)local_c0,1);
        std::__cxx11::string::~string(local_c0);
        std::vector<Word,_std::allocator<Word>_>::push_back(&wordList,(value_type *)local_a0);
        sVar7 = std::vector<Word,_std::allocator<Word>_>::size(&wordList);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar7);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        Word::~Word((Word *)local_a0);
      }
    }
    for (local_e8._36_4_ = 0; uVar5 = (ulong)(int)local_e8._36_4_,
        sVar7 = std::vector<Word,_std::allocator<Word>_>::size(&wordList), uVar5 < sVar7 - 1;
        local_e8._36_4_ = local_e8._36_4_ + 1) {
      pvVar8 = std::vector<Word,_std::allocator<Word>_>::operator[]
                         (&wordList,(long)(int)local_e8._36_4_);
      iVar4 = Word::getFrequency(pvVar8);
      if (maxCount < iVar4) {
        pvVar8 = std::vector<Word,_std::allocator<Word>_>::operator[]
                           (&wordList,(long)(int)local_e8._36_4_);
        maxCount = Word::getFrequency(pvVar8);
        std::vector<Word,_std::allocator<Word>_>::operator[](&wordList,(long)(int)local_e8._36_4_);
        Word::getWord_abi_cxx11_((Word *)(local_108 + 0x20));
        std::__cxx11::string::operator=((string *)maxWord_abi_cxx11_,(string *)(local_108 + 0x20));
        std::__cxx11::string::~string((string *)(local_108 + 0x20));
      }
      else {
        pvVar8 = std::vector<Word,_std::allocator<Word>_>::operator[]
                           (&wordList,(long)(int)local_e8._36_4_);
        iVar4 = Word::getFrequency(pvVar8);
        if (secondMaxCount < iVar4) {
          pvVar8 = std::vector<Word,_std::allocator<Word>_>::operator[]
                             (&wordList,(long)(int)local_e8._36_4_);
          secondMaxCount = Word::getFrequency(pvVar8);
          std::vector<Word,_std::allocator<Word>_>::operator[](&wordList,(long)(int)local_e8._36_4_)
          ;
          Word::getWord_abi_cxx11_((Word *)local_108);
          std::__cxx11::string::operator=((string *)secondMaxWord_abi_cxx11_,(string *)local_108);
          std::__cxx11::string::~string((string *)local_108);
        }
        else {
          pvVar8 = std::vector<Word,_std::allocator<Word>_>::operator[]
                             (&wordList,(long)(int)local_e8._36_4_);
          iVar4 = Word::getFrequency(pvVar8);
          if (thirdMaxCount < iVar4) {
            pvVar8 = std::vector<Word,_std::allocator<Word>_>::operator[]
                               (&wordList,(long)(int)local_e8._36_4_);
            thirdMaxCount = Word::getFrequency(pvVar8);
            std::vector<Word,_std::allocator<Word>_>::operator[]
                      (&wordList,(long)(int)local_e8._36_4_);
            Word::getWord_abi_cxx11_((Word *)local_128);
            std::__cxx11::string::operator=((string *)thirdMaxWord_abi_cxx11_,(string *)local_128);
            std::__cxx11::string::~string((string *)local_128);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_40);
  }
  else {
    std::__cxx11::string::string(local_148);
    std::ifstream::ifstream(local_350,"test.txt",8);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"File not found... maybe use pipey");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
      std::operator>>(local_350,local_148);
      iVar4 = std::istream::peek();
      if (iVar4 == 10) {
        std::operator<<((ostream *)compressedFile,"\n");
      }
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_148,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              maxWord_abi_cxx11_);
      if (_Var3) {
        std::operator<<((ostream *)compressedFile," 1");
      }
      else {
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_148,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )secondMaxWord_abi_cxx11_);
        if (_Var3) {
          std::operator<<((ostream *)compressedFile," 2");
        }
        else {
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_148,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)thirdMaxWord_abi_cxx11_);
          if (_Var3) {
            std::operator<<((ostream *)compressedFile," 3");
          }
          else {
            poVar6 = std::operator<<((ostream *)compressedFile," ");
            std::operator<<(poVar6,local_148);
          }
        }
      }
    }
    std::ifstream::~ifstream(local_350);
    std::__cxx11::string::~string(local_148);
  }
  return;
}

Assistant:

void middleOut(bool precompression,  ifstream &sourceFile, ofstream &compressedFile)
{

    // Ensure the source file is opened properly again
    if(sourceFile.fail())
    {
        cerr << "File not found... maybe use pipey"<< endl;
        exit(0);

    }

    // If just parsing logic is different than compressing
    if (precompression)
    {
        // Read each word in one at a time until at end of file
        string currentWord;

        while (!sourceFile.eof())
        {
            // Boolean for tracking if a word is in list already or not
            bool wordMatch = false;
            // Read current word
            sourceFile >> currentWord;
            // Debugging
            cout << currentWord << endl;

            // Loop through every word in the list of seen words and check if current word is a match
            for (int i = 0; i < wordList.size(); i++)
            {
                // If it matches word in list already set match flag to true and add plus one to frequency count of that
                // specific word frequency

                if (currentWord == wordList[i].getWord())
                {
                    wordMatch = true;
                    wordList[i].setFrequency((wordList[i].getFrequency()) + 1);
                }
            }

            // If matching flag was never set indicating non of the words in the vector are the current word than
            // save a new Word object using the current word as paramater for construction
            if (!wordMatch)
            {
                cout << "Adding word" << endl;
                // New word object with current word name and 1 as starting frequency
                Word newWord(currentWord, 1);

                // Add to back of word vector
                wordList.push_back(newWord);
                //Debugging
                cout << wordList.size() << endl;

            }

        }

        // For all words in the saved wordlist get top three most frequent ones and save to global variables
        for (int i = 0; i < wordList.size()-1; i++)
        {
            // Max word biggest bang for your buck
            if (wordList[i].getFrequency() > maxCount)
            {
                maxCount = wordList[i].getFrequency();
                maxWord = wordList[i].getWord();
            }

            // Second most common
            else if (wordList[i].getFrequency()> secondMaxCount)
            {
                // Store seccond most common
                secondMaxCount = wordList[i].getFrequency();
                secondMaxWord = wordList[i].getWord();

            }
            // Third most common
            else if (wordList[i].getFrequency() > thirdMaxCount)
            {
                thirdMaxCount  = wordList[i].getFrequency();
                thirdMaxWord = wordList[i].getWord();

            }
        }
    }

    // If not precompressing actually compress
    else
    {
        // Compress the file actually

        string currentWord;

        // Reload file and ensure it opens properly
        ifstream loadFile("test.txt");
        if (loadFile.fail())
        {
            cerr << "File not found... maybe use pipey"<< endl;
            exit(0);
        }

        // Read every word in source one at a time and replace if matches top 3
        while (!loadFile.eof())
        {

            loadFile >> currentWord;
            // Check current char to determin when to save a new line in compressed.pra
            if (loadFile.peek() == '\n')
            {
                compressedFile << "\n";
            }

            // Check for top 3 matching words if found replace with mapping byte
            if (currentWord == maxWord)
            {
                compressedFile << " 1";

            }
            else if (currentWord == secondMaxWord)
            {
                compressedFile << " 2";
            }
            else if (currentWord == thirdMaxWord)
            {
                compressedFile << " 3";
            }

            // If the word doesnt match the top 3 simple save it as is to the compressed.pra file
            else
            {
                compressedFile << " " << currentWord;
            }
        }
    }


}